

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O1

long sd_line(int child,long skip_count)

{
  int iVar1;
  long *StartSeed;
  long lVar2;
  long *local_38;
  
  iVar1 = 0;
  local_38 = &Seed[0xe].value;
  do {
    lVar2 = 0xb;
    StartSeed = local_38;
    do {
      NthElement(skip_count,StartSeed);
      StartSeed[3] = StartSeed[3] + skip_count;
      StartSeed = StartSeed + 5;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    NthElement(skip_count * 2,&Seed[0x19].value);
    Seed[0x19].nCalls = Seed[0x19].nCalls + skip_count * 2;
    iVar1 = iVar1 + 1;
  } while (iVar1 != 7);
  if (child == 1) {
    NthElement(skip_count,&Seed[0xd].value);
    Seed[0xd].nCalls = Seed[0xd].nCalls + skip_count;
    NthElement(skip_count,&Seed[0x2b].value);
    Seed[0x2b].nCalls = Seed[0x2b].nCalls + skip_count;
  }
  return 0;
}

Assistant:

long 
sd_line(int child, DSS_HUGE skip_count)
	{
	int i,j;
	
	for (j=0; j < O_LCNT_MAX; j++)
	{
		for (i=L_QTY_SD; i<= L_RFLG_SD; i++)
/*
			if (scale >= 30000 && i == L_PKEY_SD)
				ADVANCE_STREAM64(i, skip_count);
			else
*/
				ADVANCE_STREAM(i, skip_count);
		ADVANCE_STREAM(L_CMNT_SD, skip_count * 2);
	}
	
	/* need to special case this as the link between master and detail */
	if (child == 1)
	{
		ADVANCE_STREAM(O_ODATE_SD, skip_count);
		ADVANCE_STREAM(O_LCNT_SD, skip_count);
	}
	
	return(0L);
	}